

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktUniformBlockCase.cpp
# Opt level: O0

void vkt::ubo::anon_unknown_0::generateTestSrcMatrixPerElement
               (DataType elementType,ostringstream *src,string *srcName,void *basePtr,
               UniformLayoutEntry *entry,bool vector)

{
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  string local_1b8;
  string local_198;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  string local_90 [8];
  string compareType;
  allocator<char> local_59;
  string local_58 [8];
  string compare;
  bool vector_local;
  UniformLayoutEntry *entry_local;
  void *basePtr_local;
  string *srcName_local;
  ostringstream *src_local;
  DataType elementType_local;
  
  compare.field_2._M_local_buf[0xf] = vector;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"compare_",&local_59);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_90,"float",&local_91);
  std::allocator<char>::~allocator(&local_91);
  switch(elementType) {
  case TYPE_FLOAT_MAT2:
    std::__cxx11::string::string((string *)&local_b8,local_58);
    std::__cxx11::string::string((string *)&local_d8,local_90);
    writeMatrixTypeSrc(2,2,&local_b8,&local_d8,src,srcName,basePtr,entry,
                       (bool)(compare.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_b8);
    break;
  case TYPE_FLOAT_MAT2X3:
    std::__cxx11::string::string((string *)&local_f8,local_58);
    std::__cxx11::string::string((string *)&local_118,local_90);
    writeMatrixTypeSrc(2,3,&local_f8,&local_118,src,srcName,basePtr,entry,
                       (bool)(compare.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_f8);
    break;
  case TYPE_FLOAT_MAT2X4:
    std::__cxx11::string::string((string *)&local_138,local_58);
    std::__cxx11::string::string((string *)&local_158,local_90);
    writeMatrixTypeSrc(2,4,&local_138,&local_158,src,srcName,basePtr,entry,
                       (bool)(compare.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_138);
    break;
  default:
    break;
  case TYPE_FLOAT_MAT3X4:
    std::__cxx11::string::string((string *)&local_178,local_58);
    std::__cxx11::string::string((string *)&local_198,local_90);
    writeMatrixTypeSrc(3,4,&local_178,&local_198,src,srcName,basePtr,entry,
                       (bool)(compare.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    break;
  case TYPE_FLOAT_MAT4X2:
    std::__cxx11::string::string((string *)&local_1f8,local_58);
    std::__cxx11::string::string((string *)&local_218,local_90);
    writeMatrixTypeSrc(4,2,&local_1f8,&local_218,src,srcName,basePtr,entry,
                       (bool)(compare.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1f8);
    break;
  case TYPE_FLOAT_MAT4X3:
    std::__cxx11::string::string((string *)&local_238,local_58);
    std::__cxx11::string::string((string *)&local_258,local_90);
    writeMatrixTypeSrc(4,3,&local_238,&local_258,src,srcName,basePtr,entry,
                       (bool)(compare.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_238);
    break;
  case TYPE_FLOAT_MAT4:
    std::__cxx11::string::string((string *)&local_1b8,local_58);
    std::__cxx11::string::string((string *)&local_1d8,local_90);
    writeMatrixTypeSrc(4,4,&local_1b8,&local_1d8,src,srcName,basePtr,entry,
                       (bool)(compare.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  std::__cxx11::string::~string(local_90);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void generateTestSrcMatrixPerElement (glu::DataType				elementType,
									  std::ostringstream&		src,
									  const std::string&		srcName,
									  const void*				basePtr,
									  const UniformLayoutEntry&	entry,
									  bool						vector)
{
	std::string compare = "compare_";
	std::string compareType = "float";
	switch (elementType)
	{
		case glu::TYPE_FLOAT_MAT2:
			writeMatrixTypeSrc(2, 2, compare, compareType, src, srcName, basePtr, entry, vector);
			break;

		case glu::TYPE_FLOAT_MAT2X3:
			writeMatrixTypeSrc(2, 3, compare, compareType, src, srcName, basePtr, entry, vector);
			break;

		case glu::TYPE_FLOAT_MAT2X4:
			writeMatrixTypeSrc(2, 4, compare, compareType, src, srcName, basePtr, entry, vector);
			break;

		case glu::TYPE_FLOAT_MAT3X4:
			writeMatrixTypeSrc(3, 4, compare, compareType, src, srcName, basePtr, entry, vector);
			break;

		case glu::TYPE_FLOAT_MAT4:
			writeMatrixTypeSrc(4, 4, compare, compareType, src, srcName, basePtr, entry, vector);
			break;

		case glu::TYPE_FLOAT_MAT4X2:
			writeMatrixTypeSrc(4, 2, compare, compareType, src, srcName, basePtr, entry, vector);
			break;

		case glu::TYPE_FLOAT_MAT4X3:
			writeMatrixTypeSrc(4, 3, compare, compareType, src, srcName, basePtr, entry, vector);
			break;

		default:
			break;
	}
}